

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O2

void __thiscall
graphics101::HalfEdgeTriMesh::vertex_vertex_neighbors
          (HalfEdgeTriMesh *this,Index vertex_index,Indices *result)

{
  pointer plVar1;
  HalfEdgeIndex HVar2;
  const_reference __x;
  HalfEdge *pHVar3;
  HalfEdgeIndex __n;
  
  plVar1 = (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish != plVar1) {
    (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = plVar1;
  }
  HVar2 = outgoing_halfedge_index_for_vertex(this,vertex_index);
  __n = HVar2;
  do {
    __x = std::
          vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
          ::at(&this->m_halfedges,__n.value);
    std::vector<long,_std::allocator<long>_>::push_back(result,&__x->to_vertex);
    pHVar3 = halfedge(this,&__x->opposite_he);
    __n.value = (pHVar3->next_he).value;
  } while (__n.value != HVar2.value);
  return;
}

Assistant:

void HalfEdgeTriMesh::vertex_vertex_neighbors( const Index vertex_index, Indices& result ) const
{
    result.clear();

    // Get the outgoing half-edge index for the vertex.
    const HalfEdgeIndex start_hei = outgoing_halfedge_index_for_vertex( vertex_index );
    // Start the iteration at that half-edge index.
    HalfEdgeIndex hei = start_hei;
    while( true )
    {
        // Get the HalfEdge for the half-edge index.
        const HalfEdge& he = halfedge( hei );
        // Store the vertex the half-edge points to.
        result.push_back( he.to_vertex );

        // Increment to the next vertex.
        hei = halfedge( he.opposite_he ).next_he;

        // If we are back where we started, we've seen all vertices.
        if( hei == start_hei ) break;
    }
}